

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

void __thiscall
QCborContainerPrivate::appendByteData
          (QCborContainerPrivate *this,char *data,qsizetype len,Type type,ValueFlags extraFlags)

{
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_30;
  Type local_28;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.value = addByteData(this,data,len);
  local_24 = (uint)extraFlags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                   super_QFlagsStorage<QtCbor::Element::ValueFlag>.i | 2;
  local_28 = type;
  QList<QtCbor::Element>::emplaceBack<QtCbor::Element>(&this->elements,(Element *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendByteData(const char *data, qsizetype len, QCborValue::Type type,
                        QtCbor::Element::ValueFlags extraFlags = {})
    {
        elements.append(QtCbor::Element(addByteData(data, len), type,
                                        QtCbor::Element::HasByteData | extraFlags));
    }